

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O0

QVariant * __thiscall QHash<QString,_QVariant>::value(QHash<QString,_QVariant> *this,QString *key)

{
  QVariant *pQVar1;
  QVariant *in_RDI;
  QVariant *v;
  QVariant *pQVar2;
  
  pQVar2 = in_RDI;
  pQVar1 = valueImpl<QString>((QHash<QString,_QVariant> *)in_RDI,(QString *)in_RDI);
  if (pQVar1 == (QVariant *)0x0) {
    QVariant::QVariant((QVariant *)0x20bc9b);
  }
  else {
    QVariant::QVariant(in_RDI,pQVar1);
  }
  return pQVar2;
}

Assistant:

T value(const Key &key) const noexcept
    {
        if (T *v = valueImpl(key))
            return *v;
        else
            return T();
    }